

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
mxx::impl::
distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
stable_distribute(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *c,comm *comm)

{
  int iVar1;
  int rank;
  unsigned_long uVar2;
  const_iterator begin;
  const_iterator end;
  iterator out;
  undefined1 local_60 [8];
  block_decomposition<unsigned_long> part;
  size_t total_size;
  size_t local_size;
  comm *local_20;
  comm *comm_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *c_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result;
  
  local_20 = comm;
  comm_local = (comm *)c;
  c_local = __return_storage_ptr__;
  iVar1 = mxx::comm::size(comm);
  if (iVar1 == 1) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)comm_local);
  }
  else {
    local_size._7_1_ = 0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
    total_size = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            comm_local);
    uVar2 = allreduce<unsigned_long>(&total_size,local_20);
    iVar1 = mxx::comm::size(local_20);
    rank = mxx::comm::rank(local_20);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_60,uVar2,iVar1,rank);
    uVar2 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_60);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              (__return_storage_ptr__,uVar2);
    begin = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       comm_local);
    end = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     comm_local);
    out = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    (__return_storage_ptr__);
    stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )begin._M_current,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )end._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )out._M_current,local_20);
    local_size._7_1_ = 1;
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_60);
    if ((local_size._7_1_ & 1) == 0) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Container stable_distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `stable_distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::stable_distribute(c.begin(), c.end(), result.begin(), comm);

        // return the container
        return result;
    }